

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

tc_uECC_word_t
tc_uECC_vli_sub(tc_uECC_word_t *result,tc_uECC_word_t *left,tc_uECC_word_t *right,
               wordcount_t num_words)

{
  uint uVar1;
  int iVar2;
  undefined7 in_register_00000009;
  long lVar3;
  uint uVar4;
  
  iVar2 = (int)CONCAT71(in_register_00000009,num_words);
  if (num_words < '\x01') {
    iVar2 = 0;
  }
  uVar1 = 0;
  for (lVar3 = 0; iVar2 != lVar3; lVar3 = lVar3 + 1) {
    uVar4 = right[lVar3] + uVar1;
    if (uVar4 != 0) {
      uVar1 = 0;
    }
    uVar1 = uVar1 | left[lVar3] < uVar4;
    result[lVar3] = left[lVar3] - uVar4;
  }
  return uVar1;
}

Assistant:

tc_uECC_word_t tc_uECC_vli_sub(tc_uECC_word_t *result, const tc_uECC_word_t *left,
			 const tc_uECC_word_t *right, wordcount_t num_words)
{
	tc_uECC_word_t borrow = 0;
	wordcount_t i;
	for (i = 0; i < num_words; ++i) {
		tc_uECC_word_t diff = left[i] - right[i] - borrow;
		tc_uECC_word_t val = (diff > left[i]);
		borrow = cond_set(val, borrow, (diff != left[i]));

		result[i] = diff;
	}
	return borrow;
}